

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollectionCase::UniformCollectionCase
          (UniformCollectionCase *this,char *name,UniformCollection *uniformCollection_)

{
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (name == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this,glcts::fixed_sample_locations_values + 1,(allocator<char> *)&local_38)
    ;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"_",&local_39);
    std::operator+(&this->namePrefix,name,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>::SharedPtr
            (&this->uniformCollection,uniformCollection_);
  return;
}

Assistant:

UniformCollectionCase (const char* const name, const UniformCollection* uniformCollection_)
		: namePrefix			(name ? name + string("_") : "")
		, uniformCollection		(uniformCollection_)
	{
	}